

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

ostream * argparse::operator<<(ostream *stream,ArgumentParser *parser)

{
  bool bVar1;
  ostream *poVar2;
  size_t __wide;
  const_reference pvVar3;
  string *in_RSI;
  char *pcVar4;
  ostream *in_RDI;
  Argument *mOptionalArgument;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__range3_2;
  Argument *mPositionalArgument;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__range3_1;
  Argument *argument;
  const_iterator __end3;
  const_iterator __begin3;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__range3;
  size_t tLongestArgumentLength;
  sentry sen;
  Argument *in_stack_00000118;
  ostream *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff08;
  fmtflags in_stack_ffffffffffffff0c;
  ios_base *in_stack_ffffffffffffff10;
  _Self local_90;
  _Self local_88;
  string *local_80;
  reference local_78;
  _Self local_70;
  _Self local_68;
  string *local_60;
  reference local_58;
  _Self local_50;
  _Self local_48;
  string *local_40;
  ArgumentParser *in_stack_ffffffffffffffc8;
  sentry local_20 [16];
  string *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::ostream::sentry::sentry(local_20,in_RDI);
  bVar1 = std::ostream::sentry::operator_cast_to_bool(local_20);
  if (bVar1) {
    std::ios_base::setf(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    poVar2 = std::operator<<(local_8,"Usage: ");
    poVar2 = std::operator<<(poVar2,local_10);
    std::operator<<(poVar2," [options] ");
    __wide = ArgumentParser::get_length_of_longest_argument(in_stack_ffffffffffffffc8);
    local_40 = local_10 + 0x88;
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::begin
                   ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::end
                   ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while (bVar1 = std::operator==(&local_48,&local_50), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_58 = std::_List_const_iterator<argparse::Argument>::operator*
                           ((_List_const_iterator<argparse::Argument> *)in_stack_ffffffffffffff10);
      poVar2 = local_8;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffff10);
      poVar2 = std::operator<<(poVar2,(string *)pvVar3);
      std::operator<<(poVar2," ");
      std::_List_const_iterator<argparse::Argument>::operator++(&local_48);
    }
    std::operator<<(local_8,"\n\n");
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18836b
                      );
    if (!bVar1) {
      poVar2 = std::operator<<(local_8,local_10 + 0x40);
      std::operator<<(poVar2,"\n\n");
    }
    bVar1 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::empty
                      ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                       (local_10 + 0x88));
    if (!bVar1) {
      std::operator<<(local_8,"Positional arguments:\n");
    }
    local_60 = local_10 + 0x88;
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::begin
                   ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::end
                   ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while (bVar1 = std::operator==(&local_68,&local_70), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_78 = std::_List_const_iterator<argparse::Argument>::operator*
                           ((_List_const_iterator<argparse::Argument> *)in_stack_ffffffffffffff10);
      std::ios_base::width((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__wide);
      operator<<(in_stack_00000120,in_stack_00000118);
      std::_List_const_iterator<argparse::Argument>::operator++(&local_68);
    }
    bVar1 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::empty
                      ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                       (local_10 + 0xa0));
    poVar2 = local_8;
    if (!bVar1) {
      bVar1 = std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::empty
                        ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                         (local_10 + 0x88));
      pcVar4 = "\n";
      if (bVar1) {
        pcVar4 = "";
      }
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::operator<<(poVar2,"Optional arguments:\n");
    }
    local_80 = local_10 + 0xa0;
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::begin
                   ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::end
                   ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while (bVar1 = std::operator==(&local_88,&local_90), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::_List_const_iterator<argparse::Argument>::operator*
                ((_List_const_iterator<argparse::Argument> *)in_stack_ffffffffffffff10);
      std::ios_base::width((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__wide);
      operator<<(in_stack_00000120,in_stack_00000118);
      std::_List_const_iterator<argparse::Argument>::operator++(&local_88);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1885af
                      );
    if (!bVar1) {
      poVar2 = std::operator<<(local_8,local_10 + 0x60);
      std::operator<<(poVar2,"\n\n");
    }
  }
  std::ostream::sentry::~sentry(local_20);
  return local_8;
}

Assistant:

auto operator<<(std::ostream &stream, const ArgumentParser &parser)
        -> std::ostream & {
            if (auto sen = std::ostream::sentry(stream)) {
                stream.setf(std::ios_base::left);
                stream << "Usage: " << parser.mProgramName << " [options] ";
                std::size_t tLongestArgumentLength = parser.get_length_of_longest_argument();

                for (const auto &argument : parser.mPositionalArguments) {
                    stream << argument.mNames.front() << " ";
                }
                stream << "\n\n";

                if (!parser.mDescription.empty())
                    stream << parser.mDescription << "\n\n";

                if (!parser.mPositionalArguments.empty())
                    stream << "Positional arguments:\n";

                for (const auto &mPositionalArgument : parser.mPositionalArguments) {
                    stream.width(tLongestArgumentLength);
                    stream << mPositionalArgument;
                }

                if (!parser.mOptionalArguments.empty())
                    stream << (parser.mPositionalArguments.empty() ? "" : "\n")
                           << "Optional arguments:\n";

                for (const auto &mOptionalArgument : parser.mOptionalArguments) {
                    stream.width(tLongestArgumentLength);
                    stream << mOptionalArgument;
                }

                if (!parser.mEpilog.empty())
                    stream << parser.mEpilog << "\n\n";
            }

            return stream;
        }